

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_meshb(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_FILEPOS RVar1;
  uint uVar2;
  size_t sVar3;
  __off_t _Var4;
  void *pvVar5;
  size_t sVar6;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL pad;
  REF_INT cad_data_keyword;
  REF_LONG ngeom;
  REF_INT geom_keyword;
  REF_INT type;
  REF_LONG ncell;
  REF_CELL ref_cell;
  REF_INT keyword_code;
  REF_INT group;
  REF_LONG nnode;
  FILE *pFStack_548;
  REF_BOOL swap_endian;
  FILE *file;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS local_40;
  REF_FILEPOS next_position;
  REF_BOOL available;
  REF_INT dim;
  REF_INT version;
  REF_BOOL verbose;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  dim = 0;
  local_40 = -1;
  nnode._4_4_ = 0;
  pFStack_548 = (FILE *)0x0;
  _version = filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  if (ref_mpi->id == 0) {
    uVar2 = ref_import_meshb_header(filename,&available,(REF_FILEPOS *)&ref_grid);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2cd,
             "ref_part_meshb",(ulong)uVar2,"header");
      return uVar2;
    }
    if (dim != 0) {
      printf("meshb version %d\n",(ulong)(uint)available);
    }
    if (dim != 0) {
      printf("open %s\n",_version);
    }
    pFStack_548 = fopen(_version,"r");
    if (pFStack_548 == (FILE *)0x0) {
      printf("unable to open %s\n",_version);
    }
    if (pFStack_548 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2d2,
             "ref_part_meshb","unable to open file");
      return 2;
    }
    uVar2 = ref_import_meshb_jump
                      ((FILE *)pFStack_548,available,(REF_FILEPOS *)&ref_grid,3,
                       (REF_BOOL *)&next_position,&local_40);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2d5,
             "ref_part_meshb",(ulong)uVar2,"jump");
      return uVar2;
    }
    if ((int)next_position == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2d6,
             "ref_part_meshb","meshb missing dimension");
      return 1;
    }
    sVar3 = fread((void *)((long)&next_position + 4),4,1,pFStack_548);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2d7,
             "ref_part_meshb","dim",1,sVar3);
      return 1;
    }
    if (dim != 0) {
      printf("meshb dim %d\n",(ulong)next_position._4_4_);
    }
  }
  uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&available,1,1);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_bcast((REF_MPI)filename_local,(void *)((long)&next_position + 4),1,1);
    if (uVar2 == 0) {
      uVar2 = ref_grid_create((REF_GRID *)ref_mpi_local,(REF_MPI)filename_local);
      if (uVar2 == 0) {
        ref_node = *(REF_NODE *)ref_mpi_local;
        ref_geom = *(REF_GEOM *)&ref_node->blank;
        file = *(FILE **)&ref_node->ratio_method;
        *(uint *)&ref_node[1].old_n_global = (uint)(next_position._4_4_ == 2);
        if (*(int *)(*(long *)ref_node + 4) == 0) {
          uVar2 = ref_import_meshb_jump
                            ((FILE *)pFStack_548,available,(REF_FILEPOS *)&ref_grid,4,
                             (REF_BOOL *)&next_position,&local_40);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2e5,"ref_part_meshb",(ulong)uVar2,"jump");
            return uVar2;
          }
          if ((int)next_position == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2e6,"ref_part_meshb","meshb missing vertex");
            return 1;
          }
          uVar2 = ref_part_meshb_long((FILE *)pFStack_548,available,(REF_LONG *)&keyword_code);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2e7,"ref_part_meshb",(ulong)uVar2,"nnode");
            return uVar2;
          }
          if (dim != 0) {
            printf("nnode %ld\n",_keyword_code);
          }
        }
        uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&keyword_code,1,2);
        if (uVar2 == 0) {
          uVar2 = ref_part_node((FILE *)pFStack_548,nnode._4_4_,available,
                                (REF_BOOL)ref_node[1].old_n_global,(REF_NODE)ref_geom,_keyword_code)
          ;
          RVar1 = local_40;
          if (uVar2 == 0) {
            if ((*(int *)(*(long *)ref_node + 4) == 0) &&
               (_Var4 = ftello(pFStack_548), RVar1 != _Var4)) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x2ef,"ref_part_meshb","vertex file location",RVar1,_Var4);
              ref_grid_ptr_local._4_4_ = 1;
            }
            else {
              ref_cell._4_4_ = 0;
              ncell = (REF_LONG)ref_node->global;
              while ((int)ref_cell._4_4_ < 0x10) {
                if (*(int *)(*(long *)ref_node + 4) == 0) {
                  uVar2 = ref_cell_meshb_keyword((REF_CELL)ncell,(REF_INT *)&ref_cell);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x2f3,"ref_part_meshb",(ulong)uVar2,"kw");
                    return uVar2;
                  }
                  uVar2 = ref_import_meshb_jump
                                    ((FILE *)pFStack_548,available,(REF_FILEPOS *)&ref_grid,
                                     (REF_INT)ref_cell,(REF_BOOL *)&next_position,&local_40);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x2f6,"ref_part_meshb",(ulong)uVar2,"jump");
                    return uVar2;
                  }
                  if ((int)next_position != 0) {
                    uVar2 = ref_part_meshb_long((FILE *)pFStack_548,available,
                                                (REF_LONG *)&geom_keyword);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x2f8,"ref_part_meshb",(ulong)uVar2,"ncell");
                      return uVar2;
                    }
                    if (dim != 0) {
                      printf("group %d ncell %ld\n",(ulong)ref_cell._4_4_,_geom_keyword);
                    }
                  }
                }
                uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&next_position,1,1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x2fc,"ref_part_meshb",(ulong)uVar2,"bcast");
                  return uVar2;
                }
                if ((int)next_position != 0) {
                  uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&geom_keyword,1,2);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x2fe,"ref_part_meshb",(ulong)uVar2,"bcast");
                    return uVar2;
                  }
                  uVar2 = ref_part_meshb_cell((REF_CELL)ncell,_geom_keyword,(REF_NODE)ref_geom,
                                              _keyword_code,available,0,(FILE *)pFStack_548);
                  RVar1 = local_40;
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x301,"ref_part_meshb",(ulong)uVar2,"part cell");
                    return uVar2;
                  }
                  if ((*(int *)(*(long *)ref_node + 4) == 0) &&
                     (_Var4 = ftello(pFStack_548), RVar1 != _Var4)) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x303,"ref_part_meshb","cell file location",RVar1,_Var4);
                    return 1;
                  }
                }
                ref_cell._4_4_ = ref_cell._4_4_ + 1;
                ncell = (REF_LONG)(&ref_node->global)[(int)ref_cell._4_4_];
              }
              for (ngeom._4_4_ = 0; (int)ngeom._4_4_ < 3; ngeom._4_4_ = ngeom._4_4_ + 1) {
                if (*(int *)(*(long *)ref_node + 4) == 0) {
                  ngeom._0_4_ = ngeom._4_4_ + 0x28;
                  uVar2 = ref_import_meshb_jump
                                    ((FILE *)pFStack_548,available,(REF_FILEPOS *)&ref_grid,
                                     (int)ngeom,(REF_BOOL *)&next_position,&local_40);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x30c,"ref_part_meshb",(ulong)uVar2,"jump");
                    return uVar2;
                  }
                  if ((int)next_position != 0) {
                    uVar2 = ref_part_meshb_long((FILE *)pFStack_548,available,(REF_LONG *)&pad);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x30e,"ref_part_meshb",(ulong)uVar2,"ngeom");
                      return uVar2;
                    }
                    if (dim != 0) {
                      printf("type %d ngeom %ld\n",(ulong)ngeom._4_4_,_pad);
                    }
                  }
                }
                uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&next_position,1,1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x312,"ref_part_meshb",(ulong)uVar2,"bcast");
                  return uVar2;
                }
                if ((int)next_position != 0) {
                  uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&pad,1,2);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x314,"ref_part_meshb",(ulong)uVar2,"bcast");
                    return uVar2;
                  }
                  uVar2 = ref_part_meshb_geom_bcast
                                    ((REF_GEOM)file,_pad,ngeom._4_4_,(REF_NODE)ref_geom,available,
                                     (FILE *)pFStack_548);
                  RVar1 = local_40;
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x317,"ref_part_meshb",(ulong)uVar2,"part geom");
                    return uVar2;
                  }
                  if ((*(int *)(*(long *)ref_node + 4) == 0) &&
                     (_Var4 = ftello(pFStack_548), RVar1 != _Var4)) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x319,"ref_part_meshb","end location",RVar1,_Var4);
                    return 1;
                  }
                }
              }
              if (*(int *)(*(long *)ref_node + 4) == 0) {
                uVar2 = ref_import_meshb_jump
                                  ((FILE *)pFStack_548,available,(REF_FILEPOS *)&ref_grid,0x7e,
                                   (REF_BOOL *)&next_position,&local_40);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x321,"ref_part_meshb",(ulong)uVar2,"jump");
                  return uVar2;
                }
                if ((int)next_position != 0) {
                  uVar2 = ref_part_meshb_size((FILE *)pFStack_548,available,
                                              (REF_SIZE *)(file->_unused2 + 4));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x325,"ref_part_meshb",(ulong)uVar2,"cad data size");
                    return uVar2;
                  }
                  if (dim != 0) {
                    printf("cad_data_size %ld\n",*(undefined8 *)(file->_unused2 + 4));
                  }
                  if (*(long *)(file->_unused2 + 0xc) != 0) {
                    free(*(void **)(file->_unused2 + 0xc));
                  }
                  pvVar5 = malloc(*(size_t *)(file->_unused2 + 4));
                  *(void **)(file->_unused2 + 0xc) = pvVar5;
                  if (*(long *)(file->_unused2 + 0xc) == 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x32b,"ref_part_meshb",
                           "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL");
                    return 2;
                  }
                  sVar3 = *(size_t *)(file->_unused2 + 4);
                  sVar6 = fread(*(void **)(file->_unused2 + 0xc),1,*(size_t *)(file->_unused2 + 4),
                                pFStack_548);
                  RVar1 = local_40;
                  if (sVar3 != sVar6) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x32f,"ref_part_meshb","cad_data",sVar3,sVar6);
                    return 1;
                  }
                  _Var4 = ftello(pFStack_548);
                  if (RVar1 != _Var4) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x330,"ref_part_meshb","end location",RVar1,_Var4);
                    return 1;
                  }
                }
              }
              uVar2 = ref_mpi_bcast((REF_MPI)filename_local,&next_position,1,1);
              if (uVar2 == 0) {
                if ((int)next_position != 0) {
                  uVar2 = ref_mpi_bcast((REF_MPI)filename_local,file->_unused2 + 4,1,2);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x337,"ref_part_meshb",(ulong)uVar2,"bcast");
                    return uVar2;
                  }
                  if (*(int *)(*(long *)ref_node + 4) != 0) {
                    if (*(long *)(file->_unused2 + 0xc) != 0) {
                      free(*(void **)(file->_unused2 + 0xc));
                    }
                    pvVar5 = malloc(*(size_t *)(file->_unused2 + 4));
                    *(void **)(file->_unused2 + 0xc) = pvVar5;
                    if (*(long *)(file->_unused2 + 0xc) == 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x33c,"ref_part_meshb",
                             "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL");
                      return 2;
                    }
                  }
                  uVar2 = ref_mpi_bcast((REF_MPI)filename_local,*(void **)(file->_unused2 + 0xc),
                                        (REF_INT)*(undefined8 *)(file->_unused2 + 4),4);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x340,"ref_part_meshb",(ulong)uVar2,"bcast");
                    return uVar2;
                  }
                }
                uVar2 = ref_geom_ghost((REF_GEOM)file,(REF_NODE)ref_geom);
                if (uVar2 == 0) {
                  uVar2 = ref_node_ghost_real((REF_NODE)ref_geom);
                  if (uVar2 == 0) {
                    uVar2 = ref_grid_inward_boundary_orientation((REF_GRID)ref_node);
                    if (uVar2 == 0) {
                      if (*(int *)(*(long *)ref_node + 4) == 0) {
                        fclose(pFStack_548);
                      }
                      ref_grid_ptr_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x347,"ref_part_meshb",(ulong)uVar2,"inward boundary orientation");
                      ref_grid_ptr_local._4_4_ = uVar2;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x344,"ref_part_meshb",(ulong)uVar2,"ghost real");
                    ref_grid_ptr_local._4_4_ = uVar2;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x343,"ref_part_meshb",(ulong)uVar2,"fill geom ghosts");
                  ref_grid_ptr_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x333,"ref_part_meshb",(ulong)uVar2,"bcast");
                ref_grid_ptr_local._4_4_ = uVar2;
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2ed,"ref_part_meshb",(ulong)uVar2,"part node");
            ref_grid_ptr_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x2ea,"ref_part_meshb",(ulong)uVar2,"bcast");
          ref_grid_ptr_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x2dc,"ref_part_meshb",(ulong)uVar2,"create grid");
        ref_grid_ptr_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2db,
             "ref_part_meshb",(ulong)uVar2,"bcast");
      ref_grid_ptr_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x2da,
           "ref_part_meshb",(ulong)uVar2,"bcast");
    ref_grid_ptr_local._4_4_ = uVar2;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_BOOL verbose = REF_FALSE;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  FILE *file;
  REF_BOOL swap_endian = REF_FALSE;
  REF_LONG nnode;
  REF_INT group, keyword_code;
  REF_CELL ref_cell;
  REF_LONG ncell;
  REF_INT type, geom_keyword;
  REF_LONG ngeom;
  REF_INT cad_data_keyword;
  REF_BOOL pad = REF_FALSE;

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_mpi, &dim, 1, REF_INT_TYPE), "bcast");
  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);
  ref_geom = ref_grid_geom(ref_grid);
  ref_grid_twod(ref_grid) = (2 == dim);

  if (ref_grid_once(ref_grid)) {
    RSS(ref_import_meshb_jump(file, version, key_pos, 4, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing vertex");
    RSS(ref_part_meshb_long(file, version, &nnode), "nnode");
    if (verbose) printf("nnode %ld\n", nnode);
  }
  RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_part_node(file, swap_endian, version, ref_grid_twod(ref_grid),
                    ref_node, nnode),
      "part node");
  if (ref_grid_once(ref_grid))
    REIS(next_position, ftello(file), "vertex file location");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_grid_once(ref_grid)) {
      RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
      RSS(ref_import_meshb_jump(file, version, key_pos, keyword_code,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ncell), "ncell");
        if (verbose) printf("group %d ncell %ld\n", group, ncell);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_cell(ref_cell, ncell, ref_node, nnode, version, pad,
                              file),
          "part cell");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "cell file location");
    }
  }

  each_ref_type(ref_geom, type) {
    if (ref_grid_once(ref_grid)) {
      geom_keyword = 40 + type;
      RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ngeom), "ngeom");
        if (verbose) printf("type %d ngeom %ld\n", type, ngeom);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ngeom, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_geom_bcast(ref_geom, ngeom, type, ref_node, version,
                                    file),
          "part geom");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_grid_once(ref_grid)) {
    cad_data_keyword = 126; /* GmfByteFlow */
    RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                              &available, &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
          "cad data size");
      if (verbose)
        printf("cad_data_size %ld\n", (long)ref_geom_cad_data_size(ref_geom));
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
      REIS(ref_geom_cad_data_size(ref_geom),
           fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                 ref_geom_cad_data_size(ref_geom), file),
           "cad_data");
      REIS(next_position, ftello(file), "end location");
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
  if (available) {
    RSS(ref_mpi_bcast(ref_mpi, &ref_geom_cad_data_size(ref_geom), 1,
                      REF_LONG_TYPE),
        "bcast");
    if (!ref_grid_once(ref_grid)) {
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
    }
    RSS(ref_mpi_bcast(ref_mpi, ref_geom_cad_data(ref_geom),
                      (REF_INT)ref_geom_cad_data_size(ref_geom), REF_BYTE_TYPE),
        "bcast");
  }

  RSS(ref_geom_ghost(ref_geom, ref_node), "fill geom ghosts");
  RSS(ref_node_ghost_real(ref_node), "ghost real");

  RSS(ref_grid_inward_boundary_orientation(ref_grid),
      "inward boundary orientation");

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}